

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O0

void RDL_findIndegree(uint a,uint b,uint *indegree,RDL_sPathInfo *spi)

{
  uint b_00;
  uint local_24;
  uint vertex;
  uint i;
  RDL_sPathInfo *spi_local;
  uint *indegree_local;
  uint b_local;
  uint a_local;
  
  indegree[b] = 0;
  if (a != b) {
    for (local_24 = 0; local_24 < spi->dPaths[a]->degree[b]; local_24 = local_24 + 1) {
      b_00 = spi->dPaths[a]->adjList[b][local_24][0];
      if (indegree[b_00] == 0xffffffff) {
        RDL_findIndegree(a,b_00,indegree,spi);
      }
      indegree[b_00] = indegree[b_00] + 1;
    }
  }
  return;
}

Assistant:

static void RDL_findIndegree(unsigned a, unsigned b,
    unsigned *indegree, const RDL_sPathInfo *spi)
{
/* similar to the function "List_Paths" from Vismara*/
  unsigned i, vertex;

  indegree[b] = 0;

  if(a==b)
  {
    return;
  }
  /*for each vertex adjacent to b in U_a*/
  for(i=0; i<spi->dPaths[a]->degree[b]; ++i)
  {
    vertex = spi->dPaths[a]->adjList[b][i][0];
    if (indegree[vertex] == UINT_MAX) {
      RDL_findIndegree(a, vertex, indegree, spi);
    }
    indegree[vertex] += 1;
  }
}